

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

nvpair_t * nvpair_move_descriptor(char *name,int value)

{
  int iVar1;
  _Bool _Var2;
  int *piVar3;
  int _serrno;
  nvpair_t *nvp;
  int value_local;
  char *name_local;
  
  if ((value < 0) || (_Var2 = fd_is_valid(value), !_Var2)) {
    piVar3 = __errno_location();
    *piVar3 = 9;
    name_local = (char *)0x0;
  }
  else {
    name_local = (char *)nvpair_allocv(name,6,(long)value,8,0);
    if ((nvpair_t *)name_local == (nvpair_t *)0x0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      close(value);
      piVar3 = __errno_location();
      *piVar3 = iVar1;
    }
  }
  return (nvpair_t *)name_local;
}

Assistant:

nvpair_t *
nvpair_move_descriptor(const char *name, int value)
{
	nvpair_t *nvp;

	if (value < 0 || !fd_is_valid(value)) {
		ERRNO_SET(EBADF);
		return (NULL);
	}

	nvp = nvpair_allocv(name, NV_TYPE_DESCRIPTOR, (uint64_t)value,
	    sizeof(int64_t), 0);
	if (nvp == NULL) {
		ERRNO_SAVE();
		close(value);
		ERRNO_RESTORE();
	}

	return (nvp);
}